

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inja.hpp
# Opt level: O0

void __thiscall inja::Bytecode::Bytecode(Bytecode *this,Op op,json *value,uint flags)

{
  uint flags_local;
  json *value_local;
  Op op_local;
  Bytecode *this_local;
  
  this->op = op;
  *(uint *)&this->field_0x4 = *(uint *)&this->field_0x4 & 0xc0000000;
  *(uint *)&this->field_0x4 = *(uint *)&this->field_0x4 & 0x3fffffff | flags << 0x1e;
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  ::basic_json(&this->value,value);
  std::__cxx11::string::string((string *)&this->str);
  return;
}

Assistant:

explicit Bytecode(Op op, json&& value, unsigned int flags)
		: op(op), args(0), flags(flags), value(std::move(value)) {}